

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void setup_interrupts(ixgbe_device *dev)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  long in_RDI;
  uint32_t rx_queue_1;
  int vfio_epoll_fd_1;
  int vfio_event_fd_1;
  int vfio_epoll_fd;
  int vfio_event_fd;
  uint32_t rx_queue;
  int in_stack_00000210;
  int in_stack_00000234;
  uint32_t in_stack_000002b0;
  int in_stack_000002b4;
  int in_stack_00000424;
  uint local_20;
  uint local_c;
  
  if ((*(byte *)(in_RDI + 0x58) & 1) != 0) {
    pvVar3 = malloc((ulong)*(ushort *)(in_RDI + 0x10) * 0x68);
    *(void **)(in_RDI + 0x60) = pvVar3;
    iVar1 = vfio_setup_interrupt(in_stack_00000210);
    *(char *)(in_RDI + 0x68) = (char)iVar1;
    if (*(char *)(in_RDI + 0x68) == '\x01') {
      iVar1 = vfio_enable_msi(in_stack_00000234);
      iVar2 = vfio_epoll_ctl(in_stack_00000424);
      for (local_20 = 0; local_20 < *(ushort *)(in_RDI + 0x10); local_20 = local_20 + 1) {
        *(int *)(*(long *)(in_RDI + 0x60) + (ulong)local_20 * 0x68) = iVar1;
        *(int *)(*(long *)(in_RDI + 0x60) + (ulong)local_20 * 0x68 + 4) = iVar2;
        *(undefined4 *)(*(long *)(in_RDI + 0x60) + (ulong)local_20 * 0x68 + 0x34) = 0;
        *(undefined4 *)(*(long *)(in_RDI + 0x60) + (ulong)local_20 * 0x68 + 0x30) = 0;
        *(undefined8 *)(*(long *)(in_RDI + 0x60) + (ulong)local_20 * 0x68 + 0x28) = 1000000000;
      }
    }
    else if (*(char *)(in_RDI + 0x68) == '\x02') {
      for (local_c = 0; local_c < *(ushort *)(in_RDI + 0x10); local_c = local_c + 1) {
        iVar1 = vfio_enable_msix(in_stack_000002b4,in_stack_000002b0);
        iVar2 = vfio_epoll_ctl(in_stack_00000424);
        *(int *)(*(long *)(in_RDI + 0x60) + (ulong)local_c * 0x68) = iVar1;
        *(int *)(*(long *)(in_RDI + 0x60) + (ulong)local_c * 0x68 + 4) = iVar2;
        *(undefined4 *)(*(long *)(in_RDI + 0x60) + (ulong)local_c * 0x68 + 0x34) = 0;
        *(undefined4 *)(*(long *)(in_RDI + 0x60) + (ulong)local_c * 0x68 + 0x30) = 0;
        *(undefined8 *)(*(long *)(in_RDI + 0x60) + (ulong)local_c * 0x68 + 0x28) = 1000000000;
      }
    }
    else {
      fprintf(_stderr,"[WARN ] %s:%d %s(): Interrupt type not supported: %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
              0x106,"setup_interrupts",(ulong)*(byte *)(in_RDI + 0x68));
    }
  }
  return;
}

Assistant:

static void setup_interrupts(struct ixgbe_device* dev) {
	if (!dev->ixy.interrupts.interrupts_enabled) {
		return;
	}
	dev->ixy.interrupts.queues = (struct interrupt_queues*) malloc(dev->ixy.num_rx_queues * sizeof(struct interrupt_queues));
	dev->ixy.interrupts.interrupt_type = vfio_setup_interrupt(dev->ixy.vfio_fd);
	switch (dev->ixy.interrupts.interrupt_type) {
		case VFIO_PCI_MSIX_IRQ_INDEX: {
			for (uint32_t rx_queue = 0; rx_queue < dev->ixy.num_rx_queues; rx_queue++) {
				int vfio_event_fd = vfio_enable_msix(dev->ixy.vfio_fd, rx_queue);
				int vfio_epoll_fd = vfio_epoll_ctl(vfio_event_fd);
				dev->ixy.interrupts.queues[rx_queue].vfio_event_fd = vfio_event_fd;
				dev->ixy.interrupts.queues[rx_queue].vfio_epoll_fd = vfio_epoll_fd;
				dev->ixy.interrupts.queues[rx_queue].moving_avg.length = 0;
				dev->ixy.interrupts.queues[rx_queue].moving_avg.index = 0;
				dev->ixy.interrupts.queues[rx_queue].interval = INTERRUPT_INITIAL_INTERVAL;
			}
			break;
		}
		case VFIO_PCI_MSI_IRQ_INDEX: {
			int vfio_event_fd = vfio_enable_msi(dev->ixy.vfio_fd);
			int vfio_epoll_fd = vfio_epoll_ctl(vfio_event_fd);
			for (uint32_t rx_queue = 0; rx_queue < dev->ixy.num_rx_queues; rx_queue++) {
				dev->ixy.interrupts.queues[rx_queue].vfio_event_fd = vfio_event_fd;
				dev->ixy.interrupts.queues[rx_queue].vfio_epoll_fd = vfio_epoll_fd;
				dev->ixy.interrupts.queues[rx_queue].moving_avg.length = 0;
				dev->ixy.interrupts.queues[rx_queue].moving_avg.index = 0;
				dev->ixy.interrupts.queues[rx_queue].interval = INTERRUPT_INITIAL_INTERVAL;
			}
			break;
		}
		default:
			warn("Interrupt type not supported: %d", dev->ixy.interrupts.interrupt_type);
			return;
	}
}